

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gogoing_util.cpp
# Opt level: O2

int going_parse_config(char *path)

{
  istream *piVar1;
  iterator iVar2;
  int iVar3;
  string *psVar4;
  string word;
  string line;
  fstream infile;
  byte abStack_3a8 [496];
  stringstream stream;
  
  going_init_config_keyword_map();
  std::fstream::fstream(&infile,path,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  word._M_dataplus._M_p = (pointer)&word.field_2;
  word._M_string_length = 0;
  word.field_2._M_local_buf[0] = '\0';
  if ((abStack_3a8[*(long *)(_infile + -0x18)] & 5) == 0) {
    while (piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&infile,(string *)&line),
          ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&line,_S_out|_S_in)
      ;
      std::operator>>((istream *)&stream,(string *)&word);
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::find(&going_config_keyword_map_abi_cxx11_._M_t,&word);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &going_config_keyword_map_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        puts("can\'t find keyword.");
LAB_00106dbc:
        std::fstream::close();
        std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
        goto LAB_00106dd3;
      }
      if (iVar2._M_node[2]._M_color == 2) {
        psVar4 = &going_domain_abi_cxx11_;
      }
      else {
        psVar4 = &going_docroot_abi_cxx11_;
        if (iVar2._M_node[2]._M_color != _S_black) goto LAB_00106dbc;
      }
      std::operator>>((istream *)&stream,(string *)psVar4);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
    iVar3 = 0;
    std::fstream::close();
  }
  else {
    printf("%s can\'t open\n",path);
    std::fstream::close();
LAB_00106dd3:
    iVar3 = -1;
  }
  std::__cxx11::string::~string((string *)&word);
  std::__cxx11::string::~string((string *)&line);
  std::fstream::~fstream(&infile);
  return iVar3;
}

Assistant:

int going_parse_config(const char *path)
{
	going_init_config_keyword_map();
	fstream infile(path, fstream::in);
	string line, word;
	if(!infile){
		printf("%s can't open\n", path);
		infile.close();
		return -1;
	}
	while(getline(infile, line))
	{
		stringstream stream(line);
		stream >> word;//keyword
		map<string, int>::const_iterator cit = going_config_keyword_map.find(word);
		if(cit == going_config_keyword_map.end()){
			printf("can't find keyword.\n");
			infile.close();
			return -1;
		}
		switch(cit -> second){
			case GOING_DOCROOT:
				stream >> going_docroot;
				break;
			case GOING_DOMAIN:
				stream >> going_domain;
				break;
			default:
				infile.close();
				return -1;
		}
	}
	infile.close();
	return 0;
}